

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearSegmentParameter.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::DATA_TYPE::LinearSegmentParameter::operator==
          (LinearSegmentParameter *this,LinearSegmentParameter *Value)

{
  KBOOL KVar1;
  
  if (this->m_ui8SegNum != Value->m_ui8SegNum) {
    return false;
  }
  if (((((this->m_ModificationUnion).m_ui8Modifications ==
         (Value->m_ModificationUnion).m_ui8Modifications) &&
       (KVar1 = LinearObjectAppearance::operator!=(&this->m_ObjApr,&Value->m_ObjApr), !KVar1)) &&
      (KVar1 = WorldCoordinates::operator!=(&this->m_Loc,&Value->m_Loc), !KVar1)) &&
     (((KVar1 = EulerAngles::operator!=(&this->m_Ori,&Value->m_Ori), !KVar1 &&
       (this->m_ui16Length == Value->m_ui16Length)) &&
      ((this->m_ui16Width == Value->m_ui16Width && (this->m_ui16Height == Value->m_ui16Height))))))
  {
    return this->m_ui16Depth == Value->m_ui16Depth;
  }
  return false;
}

Assistant:

KBOOL LinearSegmentParameter::operator == ( const LinearSegmentParameter & Value ) const
{
    if( m_ui8SegNum                            != Value.m_ui8SegNum )                            return false;
    if( m_ModificationUnion.m_ui8Modifications != Value.m_ModificationUnion.m_ui8Modifications ) return false;
    if( m_ObjApr                               != Value.m_ObjApr )                               return false;
    if( m_Loc                                  != Value.m_Loc )                                  return false;
    if( m_Ori                                  != Value.m_Ori )                                  return false;
    if( m_ui16Length                           != Value.m_ui16Length )                           return false;
    if( m_ui16Width                            != Value.m_ui16Width )                            return false;
    if( m_ui16Height                           != Value.m_ui16Height )                           return false;
    if( m_ui16Depth                            != Value.m_ui16Depth )                            return false;
    return true;
}